

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void Curl_conn_ev_data_detach(connectdata *conn,Curl_easy *data)

{
  void *in_R9;
  
  cf_cntrl_all(conn,data,true,2,0,in_R9);
  return;
}

Assistant:

void Curl_conn_ev_data_detach(struct connectdata *conn,
                              struct Curl_easy *data)
{
  cf_cntrl_all(conn, data, TRUE, CF_CTRL_DATA_DETACH, 0, NULL);
}